

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

bool Js::DynamicProfileInfo::IsEnabled(FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  undefined4 *puVar4;
  bool bVar5;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0xea,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)0x0);
    bVar2 = IsEnabled_OptionalFunctionBody((FunctionBody *)0x0,pSVar3);
    if (!bVar2) {
      return false;
    }
  }
  else {
    pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    bVar2 = IsEnabled_OptionalFunctionBody(functionBody,pSVar3);
    if (!bVar2) {
      return false;
    }
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,WasmInOutPhase);
  bVar5 = true;
  if (bVar2) {
    bVar5 = ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) == 0;
  }
  return bVar5;
}

Assistant:

bool DynamicProfileInfo::IsEnabled(const FunctionBody *const functionBody)
    {
        Assert(functionBody);
        return (IsEnabled_OptionalFunctionBody(functionBody, functionBody->GetScriptContext())
#ifdef ENABLE_WASM
            && !(PHASE_TRACE1(Js::WasmInOutPhase) && functionBody->IsWasmFunction())
#endif
            );
    }